

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_zip_filename_encoding.c
# Opt level: O1

void test_zip_filename_encoding(void)

{
  int iVar1;
  char *pcVar2;
  archive *paVar3;
  archive_entry *paVar4;
  wchar_t wVar5;
  size_t used;
  char buff [4096];
  size_t local_1040;
  undefined1 local_1038 [7];
  char local_1031;
  undefined1 local_101a [4074];
  
  pcVar2 = setlocale(6,"en_US.UTF-8");
  if (pcVar2 == (char *)0x0) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                   ,L'\'');
    test_skipping("en_US.UTF-8 locale not available on this system.");
  }
  else {
    paVar3 = archive_write_new();
    iVar1 = archive_write_set_format_zip(paVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                        ,L'0',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_zip(a)",
                        (void *)0x0);
    iVar1 = archive_write_set_options(paVar3,"hdrcharset=UTF-8");
    if (iVar1 == 0) {
      iVar1 = archive_write_open_memory(paVar3,local_1038,0x1000,&local_1040);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                          ,L'8',0,"ARCHIVE_OK",(long)iVar1,
                          "archive_write_open_memory(a, buff, sizeof(buff), &used)",(void *)0x0);
      paVar4 = archive_entry_new2(paVar3);
      archive_entry_set_pathname(paVar4,anon_var_dwarf_3825e);
      archive_entry_set_filetype(paVar4,0x8000);
      archive_entry_set_size(paVar4,0);
      iVar1 = archive_write_header(paVar3,paVar4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                          ,L'?',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, entry)",
                          (void *)0x0);
      archive_entry_free(paVar4);
      iVar1 = archive_write_free(paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                          ,L'A',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                          ,L'E',8,"0x08",(long)local_1031,"buff[7]",(void *)0x0);
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                          ,L'F',local_101a,"buff + 30",anon_var_dwarf_3825e,
                          "\"\\xD0\\xBF\\xD1\\x80\\xD0\\xB8\"",6,"6",(void *)0x0);
      paVar3 = archive_write_new();
      iVar1 = archive_write_set_format_zip(paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                          ,L'M',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_zip(a)",
                          (void *)0x0);
      iVar1 = archive_write_open_memory(paVar3,local_1038,0x1000,&local_1040);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                          ,L'O',0,"ARCHIVE_OK",(long)iVar1,
                          "archive_write_open_memory(a, buff, sizeof(buff), &used)",(void *)0x0);
      paVar4 = archive_entry_new2(paVar3);
      archive_entry_set_pathname(paVar4,anon_var_dwarf_3825e);
      archive_entry_set_filetype(paVar4,0x8000);
      archive_entry_set_size(paVar4,0);
      iVar1 = archive_write_header(paVar3,paVar4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                          ,L'V',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, entry)",
                          (void *)0x0);
      archive_entry_free(paVar4);
      iVar1 = archive_write_free(paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                          ,L'X',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                          ,L'\\',8,"0x08",(long)local_1031,"buff[7]",(void *)0x0);
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                          ,L']',local_101a,"buff + 30",anon_var_dwarf_3825e,
                          "\"\\xD0\\xBF\\xD1\\x80\\xD0\\xB8\"",6,"6",(void *)0x0);
      paVar3 = archive_write_new();
      iVar1 = archive_write_set_format_zip(paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                          ,L'd',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_zip(a)",
                          (void *)0x0);
      iVar1 = archive_write_open_memory(paVar3,local_1038,0x1000,&local_1040);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                          ,L'f',0,"ARCHIVE_OK",(long)iVar1,
                          "archive_write_open_memory(a, buff, sizeof(buff), &used)",(void *)0x0);
      paVar4 = archive_entry_new2(paVar3);
      archive_entry_set_pathname(paVar4,"abcABC");
      archive_entry_set_filetype(paVar4,0x8000);
      archive_entry_set_size(paVar4,0);
      iVar1 = archive_write_header(paVar3,paVar4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                          ,L'm',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, entry)",
                          (void *)0x0);
      archive_entry_free(paVar4);
      iVar1 = archive_write_free(paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                          ,L'o',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                          ,L's',0,"0",(long)local_1031,"buff[7]",(void *)0x0);
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                          ,L't',local_101a,"buff + 30","abcABC","\"abcABC\"",6,"6",(void *)0x0);
    }
    else {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                     ,L'2');
      test_skipping("This system cannot convert character-set for UTF-8.");
      archive_write_free(paVar3);
    }
  }
  pcVar2 = setlocale(6,"ru_RU.KOI8-R");
  if (pcVar2 == (char *)0x0) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                   ,L'\x80');
    test_skipping("KOI8-R locale not available on this system.");
  }
  else {
    paVar3 = archive_write_new();
    iVar1 = archive_write_set_format_zip(paVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                        ,L'\x88',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_zip(a)",
                        (void *)0x0);
    iVar1 = archive_write_set_options(paVar3,"hdrcharset=UTF-8");
    if (iVar1 == 0) {
      iVar1 = archive_write_open_memory(paVar3,local_1038,0x1000,&local_1040);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                          ,L'\x90',0,"ARCHIVE_OK",(long)iVar1,
                          "archive_write_open_memory(a, buff, sizeof(buff), &used)",(void *)0x0);
      paVar4 = archive_entry_new2(paVar3);
      archive_entry_set_pathname(paVar4,anon_var_dwarf_38344);
      archive_entry_set_filetype(paVar4,0x8000);
      archive_entry_set_size(paVar4,0);
      iVar1 = archive_write_header(paVar3,paVar4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                          ,L'\x97',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, entry)",
                          (void *)0x0);
      archive_entry_free(paVar4);
      iVar1 = archive_write_free(paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                          ,L'\x99',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                          ,L'\x9d',8,"0x08",(long)local_1031,"buff[7]",(void *)0x0);
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                          ,L'\xa0',local_101a,"buff + 30",anon_var_dwarf_3825e,
                          "\"\\xD0\\xBF\\xD1\\x80\\xD0\\xB8\"",6,"6",(void *)0x0);
      paVar3 = archive_write_new();
      iVar1 = archive_write_set_format_zip(paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                          ,L'¦',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_zip(a)",
                          (void *)0x0);
      iVar1 = archive_write_open_memory(paVar3,local_1038,0x1000,&local_1040);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                          ,L'¨',0,"ARCHIVE_OK",(long)iVar1,
                          "archive_write_open_memory(a, buff, sizeof(buff), &used)",(void *)0x0);
      paVar4 = archive_entry_new2(paVar3);
      archive_entry_set_pathname(paVar4,anon_var_dwarf_38344);
      archive_entry_set_filetype(paVar4,0x8000);
      archive_entry_set_size(paVar4,0);
      iVar1 = archive_write_header(paVar3,paVar4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                          ,L'¯',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, entry)",
                          (void *)0x0);
      archive_entry_free(paVar4);
      iVar1 = archive_write_free(paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                          ,L'±',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                          ,L'µ',0,"0",(long)local_1031,"buff[7]",(void *)0x0);
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                          ,L'¸',local_101a,"buff + 30",anon_var_dwarf_38344,"\"\\xD0\\xD2\\xC9\"",3
                          ,"3",(void *)0x0);
      paVar3 = archive_write_new();
      iVar1 = archive_write_set_format_zip(paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                          ,L'À',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_zip(a)",
                          (void *)0x0);
      iVar1 = archive_write_set_options(paVar3,"hdrcharset=UTF-8");
      if (iVar1 == 0) {
        iVar1 = archive_write_open_memory(paVar3,local_1038,0x1000,&local_1040);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                            ,L'È',0,"ARCHIVE_OK",(long)iVar1,
                            "archive_write_open_memory(a, buff, sizeof(buff), &used)",(void *)0x0);
        paVar4 = archive_entry_new2(paVar3);
        archive_entry_set_pathname(paVar4,"abcABC");
        archive_entry_set_filetype(paVar4,0x8000);
        archive_entry_set_size(paVar4,0);
        iVar1 = archive_write_header(paVar3,paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                            ,L'Ï',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, entry)",
                            (void *)0x0);
        archive_entry_free(paVar4);
        iVar1 = archive_write_free(paVar3);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                            ,L'Ñ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                            ,L'Õ',0,"0",(long)local_1031,"buff[7]",(void *)0x0);
        assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                            ,L'Ö',local_101a,"buff + 30","abcABC","\"abcABC\"",6,"6",(void *)0x0);
        goto LAB_001e738a;
      }
      wVar5 = L'Â';
    }
    else {
      wVar5 = L'\x8a';
    }
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                   ,wVar5);
    test_skipping("This system cannot convert character-set from KOI8-R to UTF-8.");
    archive_write_free(paVar3);
  }
LAB_001e738a:
  pcVar2 = setlocale(6,"ru_RU.CP1251");
  if (pcVar2 == (char *)0x0) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                   ,L'å');
    test_skipping("Russian_Russia locale not available on this system.");
  }
  else {
    paVar3 = archive_write_new();
    iVar1 = archive_write_set_format_zip(paVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                        ,L'î',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_zip(a)",
                        (void *)0x0);
    iVar1 = archive_write_open_memory(paVar3,local_1038,0x1000,&local_1040);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                        ,L'ð',0,"ARCHIVE_OK",(long)iVar1,
                        "archive_write_open_memory(a, buff, sizeof(buff), &used)",(void *)0x0);
    paVar4 = archive_entry_new2(paVar3);
    archive_entry_set_pathname(paVar4,anon_var_dwarf_3838c);
    archive_entry_set_filetype(paVar4,0x8000);
    archive_entry_set_size(paVar4,0);
    iVar1 = archive_write_header(paVar3,paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                        ,L'÷',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, entry)",
                        (void *)0x0);
    archive_entry_free(paVar4);
    iVar1 = archive_write_free(paVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                        ,L'ù',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                        ,L'ý',0,"0",(long)local_1031,"buff[7]",(void *)0x0);
    assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                        ,L'Ā',local_101a,"buff + 30",anon_var_dwarf_3838c,"\"\\xEF\\xF0\\xE8\"",3,
                        "3",(void *)0x0);
  }
  pcVar2 = setlocale(6,"Russian_Russia");
  if (pcVar2 == (char *)0x0) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                   ,L'đ');
    test_skipping("Russian_Russia locale not available on this system.");
  }
  else {
    paVar3 = archive_write_new();
    iVar1 = archive_write_set_format_zip(paVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                        ,L'Ě',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_zip(a)",
                        (void *)0x0);
    iVar1 = archive_write_set_options(paVar3,"hdrcharset=UTF-8");
    if (iVar1 == 0) {
      iVar1 = archive_write_open_memory(paVar3,local_1038,0x1000,&local_1040);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                          ,L'Ģ',0,"ARCHIVE_OK",(long)iVar1,
                          "archive_write_open_memory(a, buff, sizeof(buff), &used)",(void *)0x0);
      paVar4 = archive_entry_new2(paVar3);
      archive_entry_set_pathname(paVar4,anon_var_dwarf_3838c);
      archive_entry_set_filetype(paVar4,0x8000);
      archive_entry_set_size(paVar4,0);
      iVar1 = archive_write_header(paVar3,paVar4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                          ,L'ĩ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, entry)",
                          (void *)0x0);
      archive_entry_free(paVar4);
      iVar1 = archive_write_free(paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                          ,L'ī',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                          ,L'į',8,"0x08",(long)local_1031,"buff[7]",(void *)0x0);
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                          ,L'Ĳ',local_101a,"buff + 30",anon_var_dwarf_3825e,
                          "\"\\xD0\\xBF\\xD1\\x80\\xD0\\xB8\"",6,"6",(void *)0x0);
      paVar3 = archive_write_new();
      iVar1 = archive_write_set_format_zip(paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                          ,L'Ĺ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_zip(a)",
                          (void *)0x0);
      iVar1 = archive_write_open_memory(paVar3,local_1038,0x1000,&local_1040);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                          ,L'Ļ',0,"ARCHIVE_OK",(long)iVar1,
                          "archive_write_open_memory(a, buff, sizeof(buff), &used)",(void *)0x0);
      paVar4 = archive_entry_new2(paVar3);
      archive_entry_set_pathname(paVar4,anon_var_dwarf_3838c);
      archive_entry_set_filetype(paVar4,0x8000);
      archive_entry_set_size(paVar4,0);
      iVar1 = archive_write_header(paVar3,paVar4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                          ,L'ł',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, entry)",
                          (void *)0x0);
      archive_entry_free(paVar4);
      iVar1 = archive_write_free(paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                          ,L'ń',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                          ,L'ň',0,"0",(long)local_1031,"buff[7]",(void *)0x0);
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                          ,L'ŋ',local_101a,"buff + 30",anon_var_dwarf_382b6,"\"\\xAF\\xE0\\xA8\"",3
                          ,"3",(void *)0x0);
    }
    else {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                     ,L'Ĝ');
      test_skipping("This system cannot convert character-set from Russian_Russia.CP1251 to UTF-8.")
      ;
      archive_write_free(paVar3);
    }
  }
  pcVar2 = setlocale(6,"ja_JP.eucJP");
  if (pcVar2 == (char *)0x0) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                   ,L'ŗ');
    test_skipping("eucJP locale not available on this system.");
  }
  else {
    paVar3 = archive_write_new();
    iVar1 = archive_write_set_format_zip(paVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                        ,L'ş',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_zip(a)",
                        (void *)0x0);
    iVar1 = archive_write_set_options(paVar3,"hdrcharset=UTF-8");
    if (iVar1 == 0) {
      iVar1 = archive_write_open_memory(paVar3,local_1038,0x1000,&local_1040);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                          ,L'ŧ',0,"ARCHIVE_OK",(long)iVar1,
                          "archive_write_open_memory(a, buff, sizeof(buff), &used)",(void *)0x0);
      paVar4 = archive_entry_new2(paVar3);
      archive_entry_set_pathname(paVar4,anon_var_dwarf_55d70 + 0xb);
      archive_entry_set_filetype(paVar4,0x8000);
      archive_entry_set_size(paVar4,0);
      iVar1 = archive_write_header(paVar3,paVar4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                          ,L'ů',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, entry)",
                          (void *)0x0);
      archive_entry_free(paVar4);
      iVar1 = archive_write_free(paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                          ,L'ű',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                          ,L'ŵ',8,"0x08",(long)local_1031,"buff[7]",(void *)0x0);
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                          ,L'ŷ',local_101a,"buff + 30",anon_var_dwarf_55e5c + 0x10,
                          "\"\\xE8\\xA1\\xA8.txt\"",7,"7",(void *)0x0);
      paVar3 = archive_write_new();
      iVar1 = archive_write_set_format_zip(paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                          ,L'Ž',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_zip(a)",
                          (void *)0x0);
      iVar1 = archive_write_open_memory(paVar3,local_1038,0x1000,&local_1040);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                          ,L'ſ',0,"ARCHIVE_OK",(long)iVar1,
                          "archive_write_open_memory(a, buff, sizeof(buff), &used)",(void *)0x0);
      paVar4 = archive_entry_new2(paVar3);
      archive_entry_set_pathname(paVar4,anon_var_dwarf_55d70 + 0xb);
      archive_entry_set_filetype(paVar4,0x8000);
      archive_entry_set_size(paVar4,0);
      iVar1 = archive_write_header(paVar3,paVar4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                          ,L'Ƈ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, entry)",
                          (void *)0x0);
      archive_entry_free(paVar4);
      iVar1 = archive_write_free(paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                          ,L'Ɖ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                          ,L'ƍ',0,"0",(long)local_1031,"buff[7]",(void *)0x0);
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                          ,L'Ɛ',local_101a,"buff + 30",anon_var_dwarf_55d70 + 0xb,
                          "\"\\xC9\\xBD.txt\"",6,"6",(void *)0x0);
      paVar3 = archive_write_new();
      iVar1 = archive_write_set_format_zip(paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                          ,L'Ƙ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_zip(a)",
                          (void *)0x0);
      iVar1 = archive_write_set_options(paVar3,"hdrcharset=UTF-8");
      if (iVar1 == 0) {
        iVar1 = archive_write_open_memory(paVar3,local_1038,0x1000,&local_1040);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                            ,L'Ơ',0,"ARCHIVE_OK",(long)iVar1,
                            "archive_write_open_memory(a, buff, sizeof(buff), &used)",(void *)0x0);
        paVar4 = archive_entry_new2(paVar3);
        archive_entry_set_pathname(paVar4,"abcABC");
        archive_entry_set_filetype(paVar4,0x8000);
        archive_entry_set_size(paVar4,0);
        iVar1 = archive_write_header(paVar3,paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                            ,L'ƨ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, entry)",
                            (void *)0x0);
        archive_entry_free(paVar4);
        iVar1 = archive_write_free(paVar3);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                            ,L'ƪ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                            ,L'Ʈ',0,"0",(long)local_1031,"buff[7]",(void *)0x0);
        assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                            ,L'Ư',local_101a,"buff + 30","abcABC","\"abcABC\"",6,"6",(void *)0x0);
        goto LAB_001e7c24;
      }
      wVar5 = L'ƚ';
    }
    else {
      wVar5 = L'š';
    }
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                   ,wVar5);
    test_skipping("This system cannot convert character-set from eucJP to UTF-8.");
    archive_write_free(paVar3);
  }
LAB_001e7c24:
  pcVar2 = setlocale(6,"Japanese_Japan");
  if ((pcVar2 == (char *)0x0) && (pcVar2 = setlocale(6,"ja_JP.SJIS"), pcVar2 == (char *)0x0)) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                   ,L'Ƽ');
    test_skipping("CP932/SJIS locale not available on this system.");
    return;
  }
  paVar3 = archive_write_new();
  iVar1 = archive_write_set_format_zip(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                      ,L'Ǆ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_zip(a)",
                      (void *)0x0);
  iVar1 = archive_write_set_options(paVar3,"hdrcharset=UTF-8");
  if (iVar1 == 0) {
    iVar1 = archive_write_open_memory(paVar3,local_1038,0x1000,&local_1040);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                        ,L'ǌ',0,"ARCHIVE_OK",(long)iVar1,
                        "archive_write_open_memory(a, buff, sizeof(buff), &used)",(void *)0x0);
    paVar4 = archive_entry_new2(paVar3);
    archive_entry_set_pathname(paVar4,anon_var_dwarf_9d84d + 0xb);
    archive_entry_set_filetype(paVar4,0x8000);
    archive_entry_set_size(paVar4,0);
    iVar1 = archive_write_header(paVar3,paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                        ,L'ǔ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, entry)",
                        (void *)0x0);
    archive_entry_free(paVar4);
    iVar1 = archive_write_free(paVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                        ,L'ǖ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                        ,L'ǚ',8,"0x08",(long)local_1031,"buff[7]",(void *)0x0);
    assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                        ,L'ǜ',local_101a,"buff + 30",anon_var_dwarf_55e5c + 0x10,
                        "\"\\xE8\\xA1\\xA8.txt\"",7,"7",(void *)0x0);
    paVar3 = archive_write_new();
    iVar1 = archive_write_set_format_zip(paVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                        ,L'Ǣ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_zip(a)",
                        (void *)0x0);
    iVar1 = archive_write_open_memory(paVar3,local_1038,0x1000,&local_1040);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                        ,L'Ǥ',0,"ARCHIVE_OK",(long)iVar1,
                        "archive_write_open_memory(a, buff, sizeof(buff), &used)",(void *)0x0);
    paVar4 = archive_entry_new2(paVar3);
    archive_entry_set_pathname(paVar4,anon_var_dwarf_9d84d + 0xb);
    archive_entry_set_filetype(paVar4,0x8000);
    archive_entry_set_size(paVar4,0);
    iVar1 = archive_write_header(paVar3,paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                        ,L'Ǭ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, entry)",
                        (void *)0x0);
    archive_entry_free(paVar4);
    iVar1 = archive_write_free(paVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                        ,L'Ǯ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                        ,L'ǲ',0,"0",(long)local_1031,"buff[7]",(void *)0x0);
    assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                        ,L'ǵ',local_101a,"buff + 30",anon_var_dwarf_9d84d + 0xb,
                        "\"\\x95\\x5C.txt\"",6,"6",(void *)0x0);
    paVar3 = archive_write_new();
    iVar1 = archive_write_set_format_zip(paVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                        ,L'ǽ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_zip(a)",
                        (void *)0x0);
    iVar1 = archive_write_set_options(paVar3,"hdrcharset=UTF-8");
    if (iVar1 == 0) {
      iVar1 = archive_write_open_memory(paVar3,local_1038,0x1000,&local_1040);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                          ,L'ȅ',0,"ARCHIVE_OK",(long)iVar1,
                          "archive_write_open_memory(a, buff, sizeof(buff), &used)",(void *)0x0);
      paVar4 = archive_entry_new2(paVar3);
      archive_entry_set_pathname(paVar4,"abcABC");
      archive_entry_set_filetype(paVar4,0x8000);
      archive_entry_set_size(paVar4,0);
      iVar1 = archive_write_header(paVar3,paVar4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                          ,L'ȍ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, entry)",
                          (void *)0x0);
      archive_entry_free(paVar4);
      iVar1 = archive_write_free(paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                          ,L'ȏ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                          ,L'ȓ',0,"0",(long)local_1031,"buff[7]",(void *)0x0);
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                          ,L'Ȕ',local_101a,"buff + 30","abcABC","\"abcABC\"",6,"6",(void *)0x0);
      return;
    }
    wVar5 = L'ǿ';
  }
  else {
    wVar5 = L'ǆ';
  }
  skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                 ,wVar5);
  test_skipping("This system cannot convert character-set from CP932/SJIS to UTF-8.");
  archive_write_free(paVar3);
  return;
}

Assistant:

static void
test_zip_filename_encoding_UTF8(void)
{
  	struct archive *a;
  	struct archive_entry *entry;
	char buff[4096];
	size_t used;

	if (NULL == setlocale(LC_ALL, "en_US.UTF-8")) {
		skipping("en_US.UTF-8 locale not available on this system.");
		return;
	}

	/*
	 * Verify that UTF-8 filenames are correctly stored with
	 * hdrcharset=UTF-8 option.
	 */
	a = archive_write_new();
	assertEqualInt(ARCHIVE_OK, archive_write_set_format_zip(a));
	if (archive_write_set_options(a, "hdrcharset=UTF-8") != ARCHIVE_OK) {
		skipping("This system cannot convert character-set"
		    " for UTF-8.");
		archive_write_free(a);
		return;
	}
	assertEqualInt(ARCHIVE_OK,
	    archive_write_open_memory(a, buff, sizeof(buff), &used));

	entry = archive_entry_new2(a);
	/* Set a UTF-8 filename. */
	archive_entry_set_pathname(entry, "\xD0\xBF\xD1\x80\xD0\xB8");
	archive_entry_set_filetype(entry, AE_IFREG);
	archive_entry_set_size(entry, 0);
	assertEqualInt(ARCHIVE_OK, archive_write_header(a, entry));
	archive_entry_free(entry);
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/* A bit 11 of general purpose flag should be 0x08,
	 * which indicates the filename charset is UTF-8. */
	assertEqualInt(0x08, buff[7]);
	assertEqualMem(buff + 30, "\xD0\xBF\xD1\x80\xD0\xB8", 6);

	/*
	 * Verify that UTF-8 filenames are correctly stored without
	 * hdrcharset=UTF-8 option.
	 */
	a = archive_write_new();
	assertEqualInt(ARCHIVE_OK, archive_write_set_format_zip(a));
	assertEqualInt(ARCHIVE_OK,
	    archive_write_open_memory(a, buff, sizeof(buff), &used));

	entry = archive_entry_new2(a);
	/* Set a UTF-8 filename. */
	archive_entry_set_pathname(entry, "\xD0\xBF\xD1\x80\xD0\xB8");
	archive_entry_set_filetype(entry, AE_IFREG);
	archive_entry_set_size(entry, 0);
	assertEqualInt(ARCHIVE_OK, archive_write_header(a, entry));
	archive_entry_free(entry);
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/* A bit 11 of general purpose flag should be 0x08,
	 * which indicates the filename charset is UTF-8. */
	assertEqualInt(0x08, buff[7]);
	assertEqualMem(buff + 30, "\xD0\xBF\xD1\x80\xD0\xB8", 6);

	/*
	 * Verify that A bit 11 of general purpose flag is not set
	 * when ASCII filenames are stored.
	 */
	a = archive_write_new();
	assertEqualInt(ARCHIVE_OK, archive_write_set_format_zip(a));
	assertEqualInt(ARCHIVE_OK,
	    archive_write_open_memory(a, buff, sizeof(buff), &used));

	entry = archive_entry_new2(a);
	/* Set an ASCII filename. */
	archive_entry_set_pathname(entry, "abcABC");
	archive_entry_set_filetype(entry, AE_IFREG);
	archive_entry_set_size(entry, 0);
	assertEqualInt(ARCHIVE_OK, archive_write_header(a, entry));
	archive_entry_free(entry);
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/* A bit 11 of general purpose flag should be 0,
	 * which indicates the filename charset is unknown. */
	assertEqualInt(0, buff[7]);
	assertEqualMem(buff + 30, "abcABC", 6);
}